

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                         *v)

{
  pointer pSVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar2 = 0;
      pSVar1 = (v->
               super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(v->
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x30);
      uVar2 = uVar2 + 1) {
    operator<<(os,(StringData *)((long)&(pSVar1->value)._M_dataplus._M_p + lVar3));
    if (uVar2 != ((long)(v->
                        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(v->
                       super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x30 - 1U) {
      std::operator<<(os,", ");
    }
    lVar3 = lVar3 + 0x30;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}